

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void detachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  uint uVar1;
  sqlite3 *db;
  Btree *p;
  Schema *pSVar2;
  void *pvVar3;
  int iVar4;
  char *pcVar5;
  Db *pDVar6;
  HashElem *pHVar7;
  ulong uVar8;
  Db *pDVar9;
  char *zName;
  bool bVar10;
  bool bVar11;
  char zErr [128];
  char local_b8 [136];
  
  pcVar5 = (char *)sqlite3ValueText(*argv,'\x01');
  zName = "";
  if (pcVar5 != (char *)0x0) {
    zName = pcVar5;
  }
  db = context->pOut->db;
  uVar1 = db->nDb;
  bVar10 = 0 < (int)uVar1;
  if ((int)uVar1 < 1) {
    pDVar9 = (Db *)0x0;
    bVar11 = true;
  }
  else {
    pDVar9 = db->aDb;
    pDVar6 = pDVar9 + (uVar1 - 1);
    uVar8 = 0;
    do {
      if ((pDVar9->pBt != (Btree *)0x0) &&
         (iVar4 = sqlite3DbIsNamed(db,(int)uVar8,zName), iVar4 != 0)) goto LAB_001b4eb7;
      uVar8 = uVar8 + 1;
      bVar10 = uVar8 < uVar1;
      pDVar9 = pDVar9 + 1;
    } while (uVar1 != uVar8);
    uVar8 = (ulong)uVar1;
    pDVar9 = pDVar6;
LAB_001b4eb7:
    bVar11 = (uint)uVar8 < 2;
  }
  pcVar5 = "no such database: %s";
  if ((bVar10) && (pcVar5 = "cannot detach database %s", !bVar11)) {
    p = pDVar9->pBt;
    if (((p == (Btree *)0x0) || (p->inTrans == '\0')) && (p->nBackup == 0)) {
      pHVar7 = ((db->aDb[1].pSchema)->trigHash).first;
      if (pHVar7 != (HashElem *)0x0) {
        pSVar2 = pDVar9->pSchema;
        do {
          pvVar3 = pHVar7->data;
          if (*(Schema **)((long)pvVar3 + 0x30) == pSVar2) {
            *(undefined8 *)((long)pvVar3 + 0x30) = *(undefined8 *)((long)pvVar3 + 0x28);
          }
          pHVar7 = pHVar7->next;
        } while (pHVar7 != (HashElem *)0x0);
      }
      sqlite3BtreeClose(p);
      pDVar9->pBt = (Btree *)0x0;
      pDVar9->pSchema = (Schema *)0x0;
      sqlite3CollapseDatabaseArray(db);
      return;
    }
    pcVar5 = "database %s is locked";
  }
  sqlite3_snprintf(0x80,local_b8,pcVar5,zName);
  context->isError = 1;
  sqlite3VdbeMemSetStr(context->pOut,local_b8,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  return;
}

Assistant:

static void detachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  const char *zName = (const char *)sqlite3_value_text(argv[0]);
  sqlite3 *db = sqlite3_context_db_handle(context);
  int i;
  Db *pDb = 0;
  HashElem *pEntry;
  char zErr[128];

  UNUSED_PARAMETER(NotUsed);

  if( zName==0 ) zName = "";
  for(i=0; i<db->nDb; i++){
    pDb = &db->aDb[i];
    if( pDb->pBt==0 ) continue;
    if( sqlite3DbIsNamed(db, i, zName) ) break;
  }

  if( i>=db->nDb ){
    sqlite3_snprintf(sizeof(zErr),zErr, "no such database: %s", zName);
    goto detach_error;
  }
  if( i<2 ){
    sqlite3_snprintf(sizeof(zErr),zErr, "cannot detach database %s", zName);
    goto detach_error;
  }
  if( sqlite3BtreeTxnState(pDb->pBt)!=SQLITE_TXN_NONE
   || sqlite3BtreeIsInBackup(pDb->pBt)
  ){
    sqlite3_snprintf(sizeof(zErr),zErr, "database %s is locked", zName);
    goto detach_error;
  }

  /* If any TEMP triggers reference the schema being detached, move those
  ** triggers to reference the TEMP schema itself. */
  assert( db->aDb[1].pSchema );
  pEntry = sqliteHashFirst(&db->aDb[1].pSchema->trigHash);
  while( pEntry ){
    Trigger *pTrig = (Trigger*)sqliteHashData(pEntry);
    if( pTrig->pTabSchema==pDb->pSchema ){
      pTrig->pTabSchema = pTrig->pSchema;
    }
    pEntry = sqliteHashNext(pEntry);
  }

  sqlite3BtreeClose(pDb->pBt);
  pDb->pBt = 0;
  pDb->pSchema = 0;
  sqlite3CollapseDatabaseArray(db);
  return;

detach_error:
  sqlite3_result_error(context, zErr, -1);
}